

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall
LabelSinglePropertyState<true>::Uint(LabelSinglePropertyState<true> *this,Context<true> *ctx,uint v)

{
  int iVar1;
  undefined4 extraout_var;
  BaseState<true> *pBVar2;
  
  ctx->key = ctx->key + 7;
  ctx->key_length = ctx->key_length - 7;
  iVar1 = (*(ctx->label_object_state).super_BaseState<true>._vptr_BaseState[2])
                    ((float)v,&ctx->label_object_state);
  pBVar2 = (BaseState<true> *)CONCAT44(extraout_var,iVar1);
  if (pBVar2 != (BaseState<true> *)0x0) {
    pBVar2 = ctx->previous_state;
  }
  return pBVar2;
}

Assistant:

BaseState<audit>* Uint(Context<audit>& ctx, unsigned v)
  {
    // skip "_label_"
    ctx.key += 7;
    ctx.key_length -= 7;

    if (ctx.label_object_state.Uint(ctx, v) == nullptr)
      return nullptr;

    return ctx.previous_state;
  }